

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O3

CTSize cp_decl_sizeattr(CPState *cp)

{
  uint32_t uVar1;
  CTSize CVar2;
  
  uVar1 = cp->tmask;
  cp->tmask = 0x38c0;
  cp_check(cp,0x28);
  CVar2 = cp_expr_ksize(cp);
  cp->tmask = uVar1;
  cp_check(cp,0x29);
  return CVar2;
}

Assistant:

static CTSize cp_decl_sizeattr(CPState *cp)
{
  CTSize sz;
  uint32_t oldtmask = cp->tmask;
  cp->tmask = CPNS_DEFAULT;  /* Required for expression evaluator. */
  cp_check(cp, '(');
  sz = cp_expr_ksize(cp);
  cp->tmask = oldtmask;
  cp_check(cp, ')');
  return sz;
}